

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

string * IncrString(string *orig,long increment)

{
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [35];
  undefined1 local_8d;
  allocator local_79;
  char local_78 [8];
  char buffer [64];
  long value;
  char *endptr;
  char *nptr;
  long increment_local;
  string *orig_local;
  string *Result;
  
  nptr = in_RDX;
  increment_local = increment;
  orig_local = orig;
  endptr = (char *)std::__cxx11::string::c_str();
  value = 0;
  buffer._56_8_ = strtol(endptr,(char **)&value,10);
  if (*(char *)value == '\0') {
    sprintf(local_78,"%ld",nptr + buffer._56_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)orig,local_78,&local_79);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  else {
    local_8d = 0;
    std::__cxx11::string::string((string *)orig,(string *)increment_local);
    if ((long)nptr < 0) {
      sprintf(local_78,"%ld",-(long)nptr);
      std::operator+(local_110,(char *)orig);
      std::operator+(local_f0,(char *)local_110);
      std::__cxx11::string::operator=((string *)orig,(string *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)local_110);
    }
    else {
      sprintf(local_78,"%ld",nptr);
      std::operator+(local_d0,(char *)orig);
      std::operator+(local_b0,(char *)local_d0);
      std::__cxx11::string::operator=((string *)orig,(string *)local_b0);
      std::__cxx11::string::~string((string *)local_b0);
      std::__cxx11::string::~string((string *)local_d0);
    }
  }
  return orig;
}

Assistant:

static std::string IncrString(const std::string &orig, long increment)
{
	const char *nptr = orig.c_str();
	char *endptr = 0;
	long value;
	char buffer[64];

	/*
	 * Try to convert original string
	 */
	value = strtol(nptr, &endptr, 10);

	/*
	 * Did it work?
	 */
	if (*endptr == 0)
	{
		sprintf(buffer, "%ld", value + increment);
		return buffer;
	}
	else
	{
		std::string Result = orig;
		if (increment >= 0)
		{
			sprintf(buffer, "%ld", increment);
			Result = Result + " + " + buffer;
		}
		else
		{
			sprintf(buffer, "%ld", -increment);
			Result = Result + " - " + buffer;
		}
		return Result;
	}
}